

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractTestExample.cpp
# Opt level: O1

void __thiscall AbstractTestExample::PrintDataInformation(AbstractTestExample *this)

{
  element_type *peVar1;
  pointer psVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  uVar6 = (ulong)(uint)this->trainN;
  dVar13 = 0.0;
  dVar12 = 0.0;
  dVar14 = 0.0;
  if (0 < this->trainN) {
    iVar7 = 1;
    lVar10 = 0;
    uVar11 = 0;
    iVar8 = 0;
    iVar9 = 0;
    do {
      lVar4 = std::cout;
      peVar1 = (this->trainData).
               super___shared_ptr<std::vector<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      psVar2 = (peVar1->
               super__Vector_base<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(peVar1->
                        super__Vector_base<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::shared_ptr<std::vector<double,_std::allocator<double>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4) <= uVar11)
      {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar11);
      }
      dVar13 = *(double *)
                (*(long *)(*(long *)((long)&psVar2->
                                            super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
                                    + lVar10) + 8) + -8);
      iVar9 = iVar9 + (uint)(dVar13 != 1.0);
      iVar8 = iVar8 + (uint)(dVar13 == 1.0);
      if (uVar11 == (this->trainIndexEachUpdate).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar7] - 1) {
        dVar13 = (double)iVar9 / (double)iVar8;
        dVar14 = dVar14 + dVar13;
        dVar12 = dVar12 + dVar13 * dVar13;
        iVar7 = iVar7 + 1;
        *(undefined8 *)(std::operator>> + *(long *)(std::cout + -0x18)) = 4;
        lVar3 = *(long *)(lVar4 + -0x18);
        *(uint *)(strcmp + lVar3) = *(uint *)(strcmp + lVar3) & 0xfffffefb | 4;
        *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar4 + -0x18)) = 2;
        poVar5 = std::ostream::_M_insert<double>((double)(int)uVar11 / (double)(int)uVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"   ",3);
        lVar4 = *(long *)poVar5;
        *(undefined8 *)(poVar5 + *(long *)(lVar4 + -0x18) + 0x10) = 4;
        *(uint *)(poVar5 + *(long *)(lVar4 + -0x18) + 0x18) =
             *(uint *)(poVar5 + *(long *)(lVar4 + -0x18) + 0x18) & 0xfffffefb | 4;
        *(undefined8 *)(poVar5 + *(long *)(lVar4 + -0x18) + 8) = 2;
        poVar5 = std::ostream::_M_insert<double>(dVar13);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      uVar11 = uVar11 + 1;
      uVar6 = (ulong)this->trainN;
      lVar10 = lVar10 + 0x10;
    } while ((long)uVar11 < (long)uVar6);
    dVar13 = (double)(iVar7 + -1);
  }
  dVar14 = dVar14 / dVar13;
  dVar13 = dVar12 / dVar13 - dVar14 * dVar14;
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
  }
  else {
    dVar13 = SQRT(dVar13);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"meanImbalance ",0xe);
  poVar5 = std::ostream::_M_insert<double>(dVar14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"std ",4);
  poVar5 = std::ostream::_M_insert<double>(dVar13);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"normalizedStd ",0xe);
  poVar5 = std::ostream::_M_insert<double>(dVar13 / dVar14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  return;
}

Assistant:

void AbstractTestExample::PrintDataInformation()
{
    // print imbalance ratio after one data chunk arrives
    int posN=0;
    int negN=0;
    double imbalanceRatio=0;
    double sum=0;
    double sumsq=0;
    int steps=1;
    for(int i=0; i<trainN;i++)
    {
        double tempL=trainData->at(i)->back();
        if(tempL==1.0)posN++;
        else negN++;
        
        if(i==trainIndexEachUpdate[steps]-1)
        {
            imbalanceRatio=static_cast<double>(negN)/posN;
            sum+=imbalanceRatio;
            sumsq+=imbalanceRatio*imbalanceRatio;
            steps++;
            double percent=static_cast<double>(i)/trainN;
            std::cout<<std::setw(4)<< std::fixed<< std::setprecision(2)<<percent<<"   "
                <<std::setw(4)<< std::fixed<< std::setprecision(2)<<imbalanceRatio<<std::endl;
        }
    }
    
    double meanImbalance=sum/(steps-1);
    double std=sqrt(sumsq/(steps-1)-meanImbalance*meanImbalance);
    double normalizedStd=std/meanImbalance;
    std::cout<<"meanImbalance "<<meanImbalance<< std::endl;
    std::cout<<"std "<<std<< std::endl;
    std::cout<<"normalizedStd "<<normalizedStd<< std::endl;
}